

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope.c
# Opt level: O0

void * check_label(Scope *current,token *id)

{
  bool bVar1;
  void *local_20;
  void *hold;
  token *id_local;
  Scope *current_local;
  
  local_20 = (void *)0x0;
  id_local = (token *)current;
  while( true ) {
    bVar1 = false;
    if (id_local != (token *)0x0) {
      bVar1 = id_local->type != KW_INT;
    }
    if (!bVar1) break;
    id_local = (token *)id_local->data_size;
  }
  if (id_local != (token *)0x0) {
    local_20 = Map_Check((Map *)&id_local->data,id->data,id->data_size);
  }
  return local_20;
}

Assistant:

void* check_label(struct Scope *current,struct token *id)
{
	void *hold;
	hold=NULL;
	while(current!=NULL && current->type!=FUNCTION_SCOPE)
	{
		current=current->parent;
	}

	if(current!=NULL)
	{
		hold=Map_Check(&((struct Function_Scope*)current)->labels,id->data,id->data_size);
	}
	return hold;
}